

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPrimalHeuristics.cpp
# Opt level: O2

bool __thiscall
HighsPrimalHeuristics::solveSubMip
          (HighsPrimalHeuristics *this,HighsLp *lp,HighsBasis *basis,double fixingRate,
          vector<double,_std::allocator<double>_> *colLower,
          vector<double,_std::allocator<double>_> *colUpper,HighsInt maxleaves,HighsInt maxnodes,
          HighsInt stallnodes)

{
  _Head_base<0UL,_HighsMipSolverData_*,_false> _Var1;
  int iVar2;
  long lVar3;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf;
  ulong uVar4;
  HighsMipSolver *pHVar5;
  long lVar6;
  double extraout_XMM0_Qa;
  double dVar7;
  undefined1 auVar8 [16];
  double dVar9;
  HighsSolution local_b38;
  HighsMipSolver submipsolver;
  HighsOptions submipoptions;
  HighsPseudocostInitialization pscostinit;
  HighsLp submip;
  
  HighsOptions::HighsOptions(&submipoptions,this->mipsolver->options_mip_);
  HighsLp::HighsLp(&submip,lp);
  std::vector<double,_std::allocator<double>_>::_M_move_assign(&submip.col_lower_,colLower);
  std::vector<double,_std::allocator<double>_>::_M_move_assign(&submip.col_upper_,colUpper);
  std::vector<HighsVarType,_std::allocator<HighsVarType>_>::operator=
            (&submip.integrality_,&this->mipsolver->model_->integrality_);
  submip.offset_ = 0.0;
  submipoptions.super_HighsOptionsStruct.output_flag = false;
  __buf = extraout_RDX;
  submipoptions.super_HighsOptionsStruct.mip_max_leaves = maxleaves;
  if ((lp->num_col_ == -0x36) && (lp->num_row_ == -0xac)) {
    submipoptions.super_HighsOptionsStruct.output_flag = true;
    highsBoolToString_abi_cxx11_((string *)&submipsolver,true,2);
    printf("HighsPrimalHeuristics::solveSubMip (%d, %d) with output_flag = %s\n",0xffffffffffffffca,
           0xffffff54,submipsolver.callback_);
    std::__cxx11::string::~string((string *)&submipsolver);
    __buf = extraout_RDX_00;
  }
  submipoptions.super_HighsOptionsStruct.mip_max_nodes = maxnodes;
  submipoptions.super_HighsOptionsStruct.mip_max_stall_nodes = stallnodes;
  submipoptions.super_HighsOptionsStruct.mip_pscost_minreliable = 0;
  HighsTimer::read(&this->mipsolver->timer_,0,__buf,(ulong)(uint)maxnodes);
  submipoptions.super_HighsOptionsStruct.time_limit =
       submipoptions.super_HighsOptionsStruct.time_limit - extraout_XMM0_Qa;
  _Var1._M_head_impl =
       (this->mipsolver->mipdata_)._M_t.
       super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
       super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
       super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
  submipoptions.super_HighsOptionsStruct.objective_bound = (_Var1._M_head_impl)->upper_limit;
  if (this->mipsolver->submip == false) {
    dVar9 = (_Var1._M_head_impl)->lower_bound;
    dVar7 = submipoptions.super_HighsOptionsStruct.objective_bound - dVar9;
    if (INFINITY <= dVar7) {
      if (ABS(dVar9) == INFINITY) {
        dVar7 = 0.0;
      }
      else {
        dVar7 = ABS(dVar9);
      }
    }
    submipoptions.super_HighsOptionsStruct.mip_rel_gap = 0.0;
    dVar9 = 1000.0;
    if (1000.0 <= dVar7) {
      dVar9 = dVar7;
    }
    submipoptions.super_HighsOptionsStruct.mip_abs_gap = dVar9 * (_Var1._M_head_impl)->feastol;
  }
  std::__cxx11::string::_M_assign((string *)&submipoptions.super_HighsOptionsStruct.presolve);
  submipoptions.super_HighsOptionsStruct.mip_detect_symmetry = false;
  local_b38.row_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b38.row_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b38.row_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b38.row_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_b38.row_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_b38.row_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b38.col_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b38.col_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b38.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b38.col_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_b38.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_b38.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b38.value_valid = false;
  local_b38.dual_valid = false;
  submipoptions.super_HighsOptionsStruct.mip_heuristic_effort = 0.8;
  pHVar5 = this->mipsolver;
  if (pHVar5->submip == false) {
    HighsMipAnalysis::mipTimerStart(&pHVar5->analysis_,0x3c);
    pHVar5 = this->mipsolver;
  }
  HighsMipSolver::HighsMipSolver
            (&submipsolver,pHVar5->callback_,&submipoptions,&submip,&local_b38,true,
             pHVar5->submip_level + 1);
  submipsolver.rootbasis = basis;
  HighsPseudocostInitialization::HighsPseudocostInitialization
            (&pscostinit,
             &((this->mipsolver->mipdata_)._M_t.
               super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
               _M_t.
               super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
               .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->pseudocost,1);
  _Var1._M_head_impl =
       (this->mipsolver->mipdata_)._M_t.
       super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
       super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
       super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
  submipsolver.clqtableinit = &(_Var1._M_head_impl)->cliquetable;
  submipsolver.implicinit = &(_Var1._M_head_impl)->implications;
  submipsolver.pscostinit = &pscostinit;
  HighsMipSolver::run(&submipsolver);
  pHVar5 = this->mipsolver;
  iVar2 = submipsolver.max_submip_level + 1;
  if (submipsolver.max_submip_level + 1 <= pHVar5->max_submip_level) {
    iVar2 = pHVar5->max_submip_level;
  }
  pHVar5->max_submip_level = iVar2;
  if (pHVar5->submip == false) {
    HighsMipAnalysis::mipTimerStop(&pHVar5->analysis_,0x3c);
  }
  if ((__uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>)
      submipsolver.mipdata_._M_t.
      super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
      super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
      super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>)0x0) {
    _Var1._M_head_impl =
         (this->mipsolver->mipdata_)._M_t.
         super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
         super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
         super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
    lVar6 = ((long)*(pointer *)((long)&(_Var1._M_head_impl)->continuous_cols + 8) -
             *(long *)&((_Var1._M_head_impl)->continuous_cols).
                       super__Vector_base<int,_std::allocator<int>_> >> 2) +
            ((long)*(pointer *)((long)&(_Var1._M_head_impl)->integral_cols + 8) -
             *(long *)&((_Var1._M_head_impl)->integral_cols).
                       super__Vector_base<int,_std::allocator<int>_> >> 2);
    auVar8._8_4_ = (int)((ulong)lVar6 >> 0x20);
    auVar8._0_8_ = lVar6;
    auVar8._12_4_ = 0x45300000;
    dVar9 = (auVar8._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0);
    if (dVar9 <= 1.0) {
      dVar9 = 1.0;
    }
    dVar9 = (double)(submipsolver.model_)->num_col_ / dVar9;
    dVar7 = (double)*(long *)((long)submipsolver.mipdata_._M_t.
                                    super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                                    .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl
                             + 0x6768) * dVar9;
    uVar4 = (ulong)dVar7;
    this->lp_iterations =
         this->lp_iterations + ((long)(dVar7 - 9.223372036854776e+18) & (long)uVar4 >> 0x3f | uVar4)
    ;
    lVar6 = *(long *)((long)submipsolver.mipdata_._M_t.
                            super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                            .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl +
                     0x6758);
    this->total_repair_lp =
         this->total_repair_lp +
         *(long *)((long)submipsolver.mipdata_._M_t.
                         super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                         .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl + 0x6750);
    this->total_repair_lp_feasible = this->total_repair_lp_feasible + lVar6;
    this->total_repair_lp_iterations =
         this->total_repair_lp_iterations +
         *(long *)((long)submipsolver.mipdata_._M_t.
                         super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                         .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl + 0x6760);
    if (this->mipsolver->submip == true) {
      lVar3 = (long)(dVar9 * (double)submipsolver.node_count_);
      lVar6 = 1;
      if (1 < lVar3) {
        lVar6 = lVar3;
      }
      (_Var1._M_head_impl)->num_nodes = (_Var1._M_head_impl)->num_nodes + lVar6;
    }
  }
  if (submipsolver.modelstatus_ == kInfeasible) {
    this->infeasObservations = this->infeasObservations + fixingRate;
    this->numInfeasObservations = this->numInfeasObservations + 1;
  }
  if ((((submipsolver.modelstatus_ != kInfeasible || 1 < submipsolver.node_count_) &&
       (submipsolver.modelstatus_ != kInfeasible)) &&
      (submipsolver.solution_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start !=
       submipsolver.solution_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish)) &&
     (_Var1._M_head_impl =
           (this->mipsolver->mipdata_)._M_t.
           super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
           super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
           super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl,
     iVar2 = (_Var1._M_head_impl)->numImprovingSols,
     HighsMipSolverData::trySolution(_Var1._M_head_impl,&submipsolver.solution_,4),
     ((this->mipsolver->mipdata_)._M_t.
      super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
      super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
      super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->numImprovingSols != iVar2))
  {
    this->successObservations = fixingRate + this->successObservations;
    this->numSuccessObservations = this->numSuccessObservations + 1;
  }
  HighsPseudocostInitialization::~HighsPseudocostInitialization(&pscostinit);
  HighsMipSolver::~HighsMipSolver(&submipsolver);
  HighsSolution::~HighsSolution(&local_b38);
  HighsLp::~HighsLp(&submip);
  HighsOptions::~HighsOptions(&submipoptions);
  return submipsolver.modelstatus_ != kInfeasible || 1 < submipsolver.node_count_;
}

Assistant:

bool HighsPrimalHeuristics::solveSubMip(
    const HighsLp& lp, const HighsBasis& basis, double fixingRate,
    std::vector<double> colLower, std::vector<double> colUpper,
    HighsInt maxleaves, HighsInt maxnodes, HighsInt stallnodes) {
  HighsOptions submipoptions = *mipsolver.options_mip_;
  HighsLp submip = lp;

  // set bounds and restore integrality of the lp relaxation copy
  submip.col_lower_ = std::move(colLower);
  submip.col_upper_ = std::move(colUpper);
  submip.integrality_ = mipsolver.model_->integrality_;
  submip.offset_ = 0;

  // set limits
  submipoptions.mip_max_leaves = maxleaves;
  submipoptions.output_flag = false;

  const bool allow_submip_log = true;
  if (allow_submip_log && lp.num_col_ == -54 && lp.num_row_ == -172) {
    submipoptions.output_flag = true;
    printf(
        "HighsPrimalHeuristics::solveSubMip (%d, %d) with output_flag = %s\n",
        int(lp.num_col_), int(lp.num_row_),
        highsBoolToString(submipoptions.output_flag).c_str());
  }

  submipoptions.mip_max_nodes = maxnodes;
  submipoptions.mip_max_stall_nodes = stallnodes;
  submipoptions.mip_pscost_minreliable = 0;
  submipoptions.time_limit -= mipsolver.timer_.read();
  submipoptions.objective_bound = mipsolver.mipdata_->upper_limit;

  if (!mipsolver.submip) {
    double curr_abs_gap =
        mipsolver.mipdata_->upper_limit - mipsolver.mipdata_->lower_bound;

    if (curr_abs_gap == kHighsInf) {
      curr_abs_gap = fabs(mipsolver.mipdata_->lower_bound);
      if (curr_abs_gap == kHighsInf) curr_abs_gap = 0.0;
    }

    submipoptions.mip_rel_gap = 0.0;
    submipoptions.mip_abs_gap =
        mipsolver.mipdata_->feastol * std::max(curr_abs_gap, 1000.0);
  }

  // check if only root presolve is allowed
  if (submipoptions.mip_root_presolve_only)
    submipoptions.presolve = kHighsOffString;
  else
    submipoptions.presolve = kHighsOnString;
  submipoptions.mip_detect_symmetry = false;
  submipoptions.mip_heuristic_effort = 0.8;
  // setup solver and run it

  HighsSolution solution;
  solution.value_valid = false;
  solution.dual_valid = false;
  // Create HighsMipSolver instance for sub-MIP
  if (!mipsolver.submip)
    mipsolver.analysis_.mipTimerStart(kMipClockSubMipSolve);
  HighsMipSolver submipsolver(*mipsolver.callback_, submipoptions, submip,
                              solution, true, mipsolver.submip_level + 1);
  submipsolver.rootbasis = &basis;
  HighsPseudocostInitialization pscostinit(mipsolver.mipdata_->pseudocost, 1);
  submipsolver.pscostinit = &pscostinit;
  submipsolver.clqtableinit = &mipsolver.mipdata_->cliquetable;
  submipsolver.implicinit = &mipsolver.mipdata_->implications;
  // Solve the sub-MIP
  submipsolver.run();
  mipsolver.max_submip_level =
      std::max(submipsolver.max_submip_level + 1, mipsolver.max_submip_level);
  if (!mipsolver.submip) mipsolver.analysis_.mipTimerStop(kMipClockSubMipSolve);
  if (submipsolver.mipdata_) {
    double numUnfixed = mipsolver.mipdata_->integral_cols.size() +
                        mipsolver.mipdata_->continuous_cols.size();
    double adjustmentfactor = submipsolver.numCol() / std::max(1.0, numUnfixed);
    // (double)mipsolver.orig_model_->a_matrix_.value_.size();
    int64_t adjusted_lp_iterations =
        (size_t)(adjustmentfactor * submipsolver.mipdata_->total_lp_iterations);
    lp_iterations += adjusted_lp_iterations;
    total_repair_lp += submipsolver.mipdata_->total_repair_lp;
    total_repair_lp_feasible += submipsolver.mipdata_->total_repair_lp_feasible;
    total_repair_lp_iterations +=
        submipsolver.mipdata_->total_repair_lp_iterations;
    if (mipsolver.submip)
      mipsolver.mipdata_->num_nodes += std::max(
          int64_t{1}, int64_t(adjustmentfactor * submipsolver.node_count_));
  }

  if (submipsolver.modelstatus_ == HighsModelStatus::kInfeasible) {
    infeasObservations += fixingRate;
    ++numInfeasObservations;
  }
  if (submipsolver.node_count_ <= 1 &&
      submipsolver.modelstatus_ == HighsModelStatus::kInfeasible)
    return false;
  HighsInt oldNumImprovingSols = mipsolver.mipdata_->numImprovingSols;
  if (submipsolver.modelstatus_ != HighsModelStatus::kInfeasible &&
      !submipsolver.solution_.empty()) {
    mipsolver.mipdata_->trySolution(submipsolver.solution_,
                                    kSolutionSourceSubMip);
  }

  if (mipsolver.mipdata_->numImprovingSols != oldNumImprovingSols) {
    // remember fixing rate as good
    successObservations += fixingRate;
    ++numSuccessObservations;
  }

  return true;
}